

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

LPWSTR Internal_i64tow(INT64 value,LPWSTR string,int radix,BOOL isI64)

{
  undefined1 auVar1 [16];
  short sVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  LPWSTR pWVar9;
  WCHAR WVar10;
  
  if (radix - 0x25U < 0xffffffdd) {
    fprintf(_stderr,"] %s %s:%d","Internal_i64tow",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
            ,0x65);
    fprintf(_stderr,"Invalid radix, radix must be between 2 and 36\n");
    SetLastError(0x57);
  }
  else {
    uVar3 = value & 0xffffffff;
    if (isI64 != 0) {
      uVar3 = value;
    }
    uVar8 = -value;
    if (-1 < value || radix != 10) {
      uVar8 = uVar3;
    }
    if (uVar8 == 0) {
      pWVar9 = string + 1;
      *string = L'0';
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
      pWVar9 = string;
      while (uVar8 != 0) {
        iVar5 = iVar5 + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar8;
        iVar7 = (int)uVar8 - SUB164(auVar1 / ZEXT416((uint)radix),0) * radix;
        sVar2 = (short)iVar7;
        WVar10 = sVar2 + L'W';
        if (iVar7 < 10) {
          WVar10 = sVar2 + L'0';
        }
        *pWVar9 = WVar10;
        pWVar9 = pWVar9 + 1;
        uVar8 = SUB168(auVar1 / ZEXT416((uint)radix),0);
      }
    }
    if (-1 >= value && radix == 10) {
      *pWVar9 = L'-';
      pWVar9 = pWVar9 + 1;
      iVar5 = iVar5 + 1;
    }
    *pWVar9 = L'\0';
    lVar4 = 0;
    while( true ) {
      iVar5 = iVar5 + -1;
      lVar6 = (long)iVar5;
      if (lVar6 <= lVar4) break;
      WVar10 = string[lVar4];
      string[lVar4] = string[lVar6];
      string[lVar6] = WVar10;
      lVar4 = lVar4 + 1;
    }
  }
  return string;
}

Assistant:

LPWSTR Internal_i64tow(INT64 value, LPWSTR string, int radix, BOOL isI64)
{
    int length = 0;
    int n;
    int r;
    UINT64 uval = value;
    LPWSTR stringPtr = string;
    int start = 0;
    int end;
    WCHAR tempCh;

    if (radix < 2 || radix > 36)
    {
        ASSERT( "Invalid radix, radix must be between 2 and 36\n" );
        SetLastError(ERROR_INVALID_PARAMETER);
        return string;
    }
    if (FALSE == isI64)
    {
        uval = (ULONG) uval;
    }
    if (10 == radix && value < 0)
    {
        uval = value * -1;
    }
    if(0 == uval)
    {
        ++length;
        *stringPtr++ = '0';
    }
    else while (uval > 0)
    {
        ++length;
        n = uval / radix;
        r = uval - (n * radix);
        uval /= radix;
        if (r > 9)
        {
            *stringPtr++ = r + 87;
        }
        else
        {
            *stringPtr++ = r + 48;
        }
    }
    if (10 == radix && value < 0)
    {
        *stringPtr++ = '-';
        ++length;
    }
    *stringPtr = 0; /* end the string */

    /* reverse the string */
    end = length - 1;
    while (start < end)
    {
        tempCh = string[start];
        string[start] = string[end];
        string[end] = tempCh;
        ++start;
        --end;
    }

    return string;
}